

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_resample.c
# Opt level: O0

t_int * upsampling_perform_linear(t_int *w)

{
  long lVar1;
  int *piVar2;
  t_int tVar3;
  t_int tVar4;
  int iVar5;
  int *piVar6;
  t_sample local_58;
  float local_54;
  t_sample frac;
  int index;
  t_sample findex;
  t_sample b;
  t_sample a;
  t_sample *fp;
  int n;
  int length;
  int parent;
  int up;
  t_sample *out;
  t_sample *in;
  t_resample *x;
  t_int *w_local;
  
  lVar1 = w[1];
  piVar2 = (int *)w[2];
  tVar3 = w[4];
  tVar4 = w[5];
  findex = **(t_sample **)(lVar1 + 0x30);
  index = *piVar2;
  _parent = (float *)w[3];
  for (fp._0_4_ = 0; (int)fp < (int)tVar4 * (int)tVar3; fp._0_4_ = (int)fp + 1) {
    local_54 = (float)((int)fp + 1) / (float)(int)tVar3;
    iVar5 = (int)local_54;
    local_54 = local_54 - (float)iVar5;
    if ((local_54 == 0.0) && (!NAN(local_54))) {
      local_54 = 1.0;
    }
    *_parent = (1.0 - local_54) * findex + local_54 * (float)index;
    piVar6 = piVar2 + iVar5;
    index = *piVar6;
    if (iVar5 == 0) {
      local_58 = findex;
    }
    else {
      local_58 = (t_sample)piVar6[-1];
    }
    findex = local_58;
    _parent = _parent + 1;
  }
  **(t_sample **)(lVar1 + 0x30) = findex;
  return w + 6;
}

Assistant:

t_int *upsampling_perform_linear(t_int *w)
{
  t_resample *x= (t_resample *)(w[1]);
  t_sample *in  = (t_sample *)(w[2]); /* original signal     */
  t_sample *out = (t_sample *)(w[3]); /* upsampled signal    */
  int up       = (int)(w[4]);       /* upsampling factor   */
  int parent   = (int)(w[5]);       /* original vectorsize */
  int length   = parent*up;
  int n;
  t_sample *fp;
  t_sample a=*x->buffer, b=*in;


  for (n=0; n<length; n++) {
    t_sample findex = (t_sample)(n+1)/up;
    int     index  = findex;
    t_sample frac=findex - index;
    if (frac==0.)frac=1.;
    *out++ = frac * b + (1.-frac) * a;
    fp = in+index;
    b=*fp;
    a=(index)?*(fp-1):a;
  }

  *x->buffer = a;
  return (w+6);
}